

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_array(Context *ctx,VariableList *var)

{
  uint uVar1;
  uint uVar2;
  int metalbase;
  int base;
  VariableList *var_local;
  Context *ctx_local;
  
  uVar1 = var->index;
  uVar2 = ctx->uniform_float4_count;
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"const int ARRAYBASE_%d = %d;",(ulong)uVar1,(ulong)uVar2);
  pop_output(ctx);
  var->emit_position = uVar2;
  return;
}

Assistant:

static void emit_METAL_array(Context *ctx, VariableList *var)
{
    // All uniforms (except constant arrays, which are literally constant
    //  data embedded in Metal shaders) are now packed into a single array,
    //  so we can batch the uniform transfers. So this doesn't actually
    //  define an array here; the one, big array is emitted during
    //  finalization instead.
    // However, we need to #define the offset into the one, big array here,
    //  and let dereferences use that #define.
    const int base = var->index;
    const int metalbase = ctx->uniform_float4_count;
    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;
    output_line(ctx, "const int ARRAYBASE_%d = %d;", base, metalbase);
    pop_output(ctx);
    var->emit_position = metalbase;
}